

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

LY_ERR yang_parse_module(lysp_yang_ctx **context,ly_in *in,lys_module *mod)

{
  LY_ERR LVar1;
  void *pvVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  ly_ctx *local_88;
  ly_ctx *local_78;
  undefined1 local_70 [8];
  lysf_ctx fctx;
  lysp_module *mod_p;
  ly_stmt kw;
  size_t word_len;
  char *word;
  lys_module *plStack_28;
  LY_ERR ret;
  lys_module *mod_local;
  ly_in *in_local;
  lysp_yang_ctx **context_local;
  
  word._4_4_ = LY_SUCCESS;
  fctx.ext_set.field_2.dnodes = (lyd_node **)0x0;
  plStack_28 = mod;
  mod_local = (lys_module *)in;
  in_local = (ly_in *)context;
  memset(local_70,0,0x20);
  local_70 = (undefined1  [8])plStack_28->ctx;
  pvVar2 = calloc(1,0x60);
  *(void **)in_local = pvVar2;
  if (*(long *)in_local == 0) {
    ly_log(plStack_28->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","yang_parse_module");
    context_local._4_4_ = LY_EMEM;
  }
  else {
    **(undefined4 **)in_local = 1;
    LVar1 = ly_set_new((ly_set **)(*(long *)in_local + 0x38));
    if (LVar1 == LY_SUCCESS) {
      *(lys_module **)(*(long *)in_local + 0x48) = mod_local;
      *(undefined8 *)(*(long *)in_local + 0x40) = *(undefined8 *)in_local;
      fctx.ext_set.field_2.dnodes = (lyd_node **)calloc(1,0x80);
      if (fctx.ext_set.field_2.dnodes == (lyd_node **)0x0) {
        ly_log(plStack_28->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
               "yang_parse_module");
      }
      else {
        *fctx.ext_set.field_2.dnodes = (lyd_node *)plStack_28;
        ly_set_add(*(ly_set **)(*(long *)in_local + 0x38),fctx.ext_set.field_2.dnodes,'\x01',
                   (uint32_t *)0x0);
        ly_log_location((lysc_node *)0x0,(lyd_node *)0x0,(char *)0x0,(ly_in *)mod_local);
        word._4_4_ = skip_redundant_chars(*(lysp_yang_ctx **)in_local);
        if ((word._4_4_ == LY_SUCCESS) &&
           (word._4_4_ = get_keyword(*(lysp_yang_ctx **)in_local,(ly_stmt *)((long)&mod_p + 4),
                                     (char **)&word_len,(size_t *)&stack0xffffffffffffffc0),
           word._4_4_ == LY_SUCCESS)) {
          if (mod_p._4_4_ == LY_STMT_SUBMODULE) {
            ly_log(plStack_28->ctx,LY_LLERR,LY_EDENIED,
                   "Input data contains submodule which cannot be parsed directly without its main module."
                  );
            word._4_4_ = LY_EINVAL;
          }
          else if (mod_p._4_4_ == LY_STMT_MODULE) {
            word._4_4_ = parse_module(*(lysp_yang_ctx **)in_local,
                                      (lysp_module *)fctx.ext_set.field_2.dnodes);
            if ((word._4_4_ == LY_SUCCESS) &&
               (word._4_4_ = skip_redundant_chars(*(lysp_yang_ctx **)in_local),
               word._4_4_ == LY_SUCCESS)) {
              if (*mod_local->name == '\0') {
                plStack_28->parsed = (lysp_module *)fctx.ext_set.field_2;
              }
              else {
                if (*(long *)in_local == 0) {
                  local_88 = (ly_ctx *)0x0;
                }
                else {
                  local_88 = *(ly_ctx **)
                              **(undefined8 **)
                                (*(long *)(*(long *)(*(long *)in_local + 0x38) + 8) +
                                (ulong)(*(int *)(*(long *)(*(long *)in_local + 0x38) + 4) - 1) * 8);
                }
                pcVar3 = mod_local->name;
                sVar4 = strlen(mod_local->name);
                pcVar5 = "";
                if (0xf < sVar4) {
                  pcVar5 = "...";
                }
                ly_vlog(local_88,(char *)0x0,LYVE_SYNTAX,
                        "Trailing garbage \"%.*s%s\" after module, expected end-of-input.",0xf,
                        pcVar3,pcVar5);
                word._4_4_ = LY_EVALID;
              }
            }
          }
          else {
            if (*(long *)in_local == 0) {
              local_78 = (ly_ctx *)0x0;
            }
            else {
              local_78 = *(ly_ctx **)
                          **(undefined8 **)
                            (*(long *)(*(long *)(*(long *)in_local + 0x38) + 8) +
                            (ulong)(*(int *)(*(long *)(*(long *)in_local + 0x38) + 4) - 1) * 8);
            }
            pcVar3 = lyplg_ext_stmt2str(mod_p._4_4_);
            ly_vlog(local_78,(char *)0x0,LYVE_SYNTAX,
                    "Invalid keyword \"%s\", expected \"module\" or \"submodule\".",pcVar3);
            word._4_4_ = LY_EVALID;
          }
        }
      }
      ly_log_location_revert(0,0,0,1);
      if (word._4_4_ != LY_SUCCESS) {
        lysp_module_free((lysf_ctx *)local_70,(lysp_module *)fctx.ext_set.field_2.dnodes);
        lysp_yang_ctx_free(*(lysp_yang_ctx **)in_local);
        *(undefined8 *)in_local = 0;
      }
      context_local._4_4_ = word._4_4_;
    }
    else {
      free(*(void **)in_local);
      ly_log(plStack_28->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","yang_parse_module"
            );
      context_local._4_4_ = LY_EMEM;
    }
  }
  return context_local._4_4_;
}

Assistant:

LY_ERR
yang_parse_module(struct lysp_yang_ctx **context, struct ly_in *in, struct lys_module *mod)
{
    LY_ERR ret = LY_SUCCESS;
    char *word;
    size_t word_len;
    enum ly_stmt kw;
    struct lysp_module *mod_p = NULL;
    struct lysf_ctx fctx = {.ctx = mod->ctx};

    /* create context */
    *context = calloc(1, sizeof **context);
    LY_CHECK_ERR_RET(!(*context), LOGMEM(mod->ctx), LY_EMEM);
    (*context)->format = LYS_IN_YANG;
    LY_CHECK_ERR_RET(ly_set_new(&(*context)->parsed_mods), free(*context); LOGMEM(mod->ctx), LY_EMEM);
    (*context)->in = in;
    (*context)->main_ctx = (struct lysp_ctx *)(*context);

    mod_p = calloc(1, sizeof *mod_p);
    LY_CHECK_ERR_GOTO(!mod_p, LOGMEM(mod->ctx), cleanup);
    mod_p->mod = mod;
    ly_set_add((*context)->parsed_mods, mod_p, 1, NULL);

    ly_log_location(NULL, NULL, NULL, in);

    /* skip redundant but valid characters at the beginning */
    ret = skip_redundant_chars(*context);
    LY_CHECK_GOTO(ret, cleanup);

    /* "module"/"submodule" */
    ret = get_keyword(*context, &kw, &word, &word_len);
    LY_CHECK_GOTO(ret, cleanup);

    if (kw == LY_STMT_SUBMODULE) {
        LOGERR(mod->ctx, LY_EDENIED, "Input data contains submodule which cannot be parsed directly without its main module.");
        ret = LY_EINVAL;
        goto cleanup;
    } else if (kw != LY_STMT_MODULE) {
        LOGVAL_PARSER((*context), LY_VCODE_MOD_SUBOMD, lyplg_ext_stmt2str(kw));
        ret = LY_EVALID;
        goto cleanup;
    }

    /* substatements */
    ret = parse_module(*context, mod_p);
    LY_CHECK_GOTO(ret, cleanup);

    /* skip redundant but valid characters at the end */
    ret = skip_redundant_chars(*context);
    LY_CHECK_GOTO(ret, cleanup);
    if (in->current[0]) {
        LOGVAL_PARSER(*context, LY_VCODE_TRAILING_MOD, 15, in->current, strlen(in->current) > 15 ? "..." : "");
        ret = LY_EVALID;
        goto cleanup;
    }

    mod->parsed = mod_p;

cleanup:
    ly_log_location_revert(0, 0, 0, 1);
    if (ret) {
        lysp_module_free(&fctx, mod_p);
        lysp_yang_ctx_free(*context);
        *context = NULL;
    }

    return ret;
}